

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListValueBind<true>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  string *fmt_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  pointer pEVar5;
  undefined8 uVar6;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  ClientContext *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  string error;
  idx_t k;
  idx_t error_index;
  string list_arguments;
  LogicalType arg_type;
  idx_t i;
  LogicalType child_type;
  LogicalType *in_stack_fffffffffffffd48;
  LogicalType *in_stack_fffffffffffffd50;
  LogicalType *pLVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  allocator *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  optional_idx *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffdb8;
  optional_idx error_location;
  LogicalType local_210 [24];
  LogicalType local_1f8 [31];
  undefined1 local_1d9;
  bool local_1d8;
  string local_1d0 [32];
  idx_t local_1b0;
  string local_1a8 [32];
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  undefined1 local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  ulong local_a0;
  undefined8 local_98;
  allocator local_89;
  string local_88 [48];
  Expression local_58 [24];
  ulong local_40;
  LogicalType local_38 [24];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  ClientContext *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar2 = std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::empty(in_stack_fffffffffffffd60);
  if (bVar2) {
    duckdb::LogicalType::LogicalType(local_38,SQLNULL);
  }
  else {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffd50);
    duckdb::ExpressionBinder::GetExpressionReturnType((Expression *)local_38);
  }
  local_40 = 1;
  while( true ) {
    error_location.index = local_40;
    sVar4 = std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size(local_20);
    if (sVar4 <= error_location.index) {
      duckdb::LogicalType::NormalizeType(local_1f8);
      pLVar7 = local_1f8;
      LogicalType::operator=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      duckdb::LogicalType::~LogicalType(pLVar7);
      LogicalType::operator=(pLVar7,in_stack_fffffffffffffd50);
      duckdb::LogicalType::LIST(local_210);
      pLVar7 = local_210;
      LogicalType::operator=(pLVar7,in_stack_fffffffffffffd48);
      duckdb::LogicalType::~LogicalType(pLVar7);
      make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>
                ((LogicalType *)in_stack_fffffffffffffd88);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<duckdb::VariableReturnBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)pLVar7,
                 (unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>_>
                  *)in_stack_fffffffffffffd48);
      unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
      ::~unique_ptr((unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
                     *)0xd4d901);
      duckdb::LogicalType::~LogicalType(local_38);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    fmt_str = (string *)
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffffd50);
    duckdb::ExpressionBinder::GetExpressionReturnType(local_58);
    bVar3 = duckdb::LogicalType::TryGetMaxLogicalType
                      (local_10,local_38,(LogicalType *)local_58,local_38);
    if ((bVar3 & 1) == 0) break;
    duckdb::LogicalType::~LogicalType((LogicalType *)local_58);
    local_40 = local_40 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Full list: ",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_98 = std::__cxx11::string::size();
  local_a0 = 0;
  while( true ) {
    uVar1 = local_a0;
    sVar4 = std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size(local_20);
    if (sVar4 <= uVar1) break;
    if (local_a0 != 0) {
      std::__cxx11::string::operator+=(local_88,", ");
    }
    if (local_a0 == local_40) {
      local_98 = std::__cxx11::string::size();
    }
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffd50);
    (**(code **)(*(long *)pEVar5 + 0x40))(local_100);
    std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
    in_stack_fffffffffffffd90 =
         (optional_idx *)
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
         ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
    in_stack_fffffffffffffd88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_fffffffffffffd50);
    duckdb::LogicalType::ToString_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::__cxx11::string::operator+=(local_88,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    local_a0 = local_a0 + 1;
  }
  paVar8 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,"Cannot unpivot columns of types %s and %s - an explicit cast is required",
             paVar8);
  duckdb::LogicalType::ToString_abi_cxx11_();
  duckdb::LogicalType::ToString_abi_cxx11_();
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (fmt_str,params,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar3,in_stack_fffffffffffffdb8));
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_1d9 = 1;
  uVar6 = __cxa_allocate_exception(0x10);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd50);
  local_1b0 = (idx_t)BaseExpression::GetQueryLocation((BaseExpression *)pEVar5);
  optional_idx::optional_idx(in_stack_fffffffffffffd90,(idx_t)in_stack_fffffffffffffd88);
  duckdb::QueryErrorContext::Format(local_1d0,local_88,(optional_idx)local_140,local_1d8);
  BinderException::BinderException<>((BinderException *)fmt_str,error_location,params);
  local_1d9 = 0;
  __cxa_throw(uVar6,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

static unique_ptr<FunctionData> ListValueBind(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	// collect names and deconflict, construct return type
	LogicalType child_type =
	    arguments.empty() ? LogicalType::SQLNULL : ExpressionBinder::GetExpressionReturnType(*arguments[0]);
	for (idx_t i = 1; i < arguments.size(); i++) {
		auto arg_type = ExpressionBinder::GetExpressionReturnType(*arguments[i]);
		if (!LogicalType::TryGetMaxLogicalType(context, child_type, arg_type, child_type)) {
			if (IS_UNPIVOT) {
				string list_arguments = "Full list: ";
				idx_t error_index = list_arguments.size();
				for (idx_t k = 0; k < arguments.size(); k++) {
					if (k > 0) {
						list_arguments += ", ";
					}
					if (k == i) {
						error_index = list_arguments.size();
					}
					list_arguments += arguments[k]->ToString() + " " + arguments[k]->return_type.ToString();
				}
				auto error =
				    StringUtil::Format("Cannot unpivot columns of types %s and %s - an explicit cast is required",
				                       child_type.ToString(), arg_type.ToString());
				throw BinderException(arguments[i]->GetQueryLocation(),
				                      QueryErrorContext::Format(list_arguments, error, error_index, false));
			} else {
				throw BinderException(arguments[i]->GetQueryLocation(),
				                      "Cannot create a list of types %s and %s - an explicit cast is required",
				                      child_type.ToString(), arg_type.ToString());
			}
		}
	}
	child_type = LogicalType::NormalizeType(child_type);

	// this is more for completeness reasons
	bound_function.varargs = child_type;
	bound_function.return_type = LogicalType::LIST(child_type);
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}